

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

void __thiscall CppGenerator::aggregateGenerator(CppGenerator *this,size_t group_id,TDNode *node)

{
  ulong uVar1;
  bool bVar2;
  reference ppAVar3;
  size_type sVar4;
  size_type sVar5;
  ostream *poVar6;
  reference pvVar7;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *pdVar8;
  long in_RDX;
  size_type in_RSI;
  long in_RDI;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  localAggReg;
  Aggregate aggregate;
  size_t aggNo_1;
  size_t *incViewID;
  iterator __end6;
  iterator __begin6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range6;
  size_t var;
  dyn_bitset loopFactors;
  size_t inc;
  size_t incCounter;
  size_t aggNo;
  size_t numberIncomingViews;
  View *view;
  size_t *viewID;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  var_bitset *varOrderBitset;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *varOrder;
  size_t in_stack_00000bc8;
  size_t in_stack_00000bd0;
  size_t in_stack_00000bd8;
  size_t in_stack_00000be0;
  Aggregate *in_stack_00000be8;
  CppGenerator *in_stack_00000bf0;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *in_stack_00000c00;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd48;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  Aggregate *in_stack_fffffffffffffd58;
  Aggregate *in_stack_fffffffffffffd60;
  size_type in_stack_fffffffffffffd68;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd70;
  ulong local_220;
  undefined1 local_15d [29];
  undefined1 local_140 [72];
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_f8;
  reference local_f0;
  reference local_e0;
  unsigned_long *local_d8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_d0;
  long local_c8;
  reference local_c0;
  ulong local_b0;
  ulong local_70;
  size_type local_68;
  ulong local_60;
  ulong local_58;
  View *local_50;
  size_type *local_48;
  unsigned_long *local_40;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_38;
  reference local_30;
  reference local_28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_20;
  long local_18;
  size_type local_10;
  
  local_20 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             (*(long *)(in_RDI + 0xb8) + in_RSI * 0x18);
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::operator[]
                       ((vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *)
                        (in_RDI + 0xd0),in_RSI);
  std::__cxx11::string::clear();
  computeViewLevel((CppGenerator *)aggNo_1,
                   (size_t)aggregate._incoming.
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (TDNode *)
                   aggregate._incoming.
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
  ::clear((vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
           *)0x2a91bb);
  std::
  vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
  ::clear((vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
           *)0x2a91cf);
  std::
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::clear((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           *)0x2a91e3);
  std::
  vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
  ::clear((vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
           *)0x2a91f7);
  std::
  vector<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
  ::clear((vector<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
           *)0x2a920b);
  std::
  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
  ::clear((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
           *)0x2a921f);
  std::
  vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
  ::clear((vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
           *)0x2a9233);
  std::
  vector<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
  ::clear((vector<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
           *)0x2a9247);
  std::
  vector<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
  ::clear((vector<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
           *)0x2a925b);
  std::
  vector<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>,_std::allocator<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>_>_>
  ::clear((vector<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>,_std::allocator<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>_>_>
           *)0x2a926f);
  std::
  vector<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
  ::clear((vector<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
           *)0x2a9283);
  std::
  vector<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>,_std::allocator<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>_>_>
  ::clear((vector<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>,_std::allocator<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>_>_>
           *)0x2a9297);
  std::
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::clear((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
           *)0x2a92ab);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *)0x2a92bf);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *)0x2a92d3);
  std::
  vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
  ::clear((vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
           *)0x2a92e7);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
  std::
  vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
  ::resize((vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
            *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
  std::
  vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
  ::resize((vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
            *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
  std::
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::resize((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
  std::
  vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
  ::resize((vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
            *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
  std::
  vector<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
  ::resize((vector<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
            *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
  std::
  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
  ::resize((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
            *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
  std::
  vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
  ::resize((vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
            *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
  std::
  vector<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>,_std::allocator<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>_>_>
  ::resize((vector<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>,_std::allocator<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>_>_>
            *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
  std::
  vector<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
  ::resize((vector<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
            *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
  std::
  vector<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>,_std::allocator<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>_>_>
  ::resize((vector<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>,_std::allocator<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>_>_>
            *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
  std::
  vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::resize((vector<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::
  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
  ::size((vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
          *)(in_RDI + 0x2f0));
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::
  vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
  ::size((vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
          *)(in_RDI + 0x3a0));
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::
  vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
  ::size((vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
          *)(in_RDI + 0x3f0));
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *)0x2a967f);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
  std::
  vector<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
  ::resize((vector<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
            *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
  std::
  vector<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
  ::resize((vector<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
            *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2a9744);
  QueryCompiler::numberOfViews((QueryCompiler *)0x2a974c);
  std::
  vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
  ::resize((vector<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
            *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
  std::
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  ::resize((vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
            *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  local_30 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)(in_RDI + 0xf0),local_10);
  local_38._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 (&in_stack_fffffffffffffd48->m_bits);
  local_40 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       (&in_stack_fffffffffffffd48->m_bits);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_fffffffffffffd48);
    if (!bVar2) {
      return;
    }
    local_48 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_38);
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2a9821);
    local_50 = QueryCompiler::getView
                         ((QueryCompiler *)
                          CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                          (size_t)in_stack_fffffffffffffd48);
    if (local_50->_origin == local_50->_destination) {
      local_220 = *(ulong *)(local_18 + 0x30);
    }
    else {
      local_220 = *(long *)(local_18 + 0x30) - 1;
    }
    local_58 = local_220;
    ppAVar3 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                        (&local_50->_aggregates,0);
    sVar4 = std::
            vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::size(&(*ppAVar3)->_incoming);
    ppAVar3 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                        (&local_50->_aggregates,0);
    sVar5 = std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::size
                      (&(*ppAVar3)->_agg);
    if (local_220 != sVar4 / sVar5) break;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2a9bb4);
    QueryCompiler::numberOfViews((QueryCompiler *)0x2a9bbc);
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2a9bd6);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               (unsigned_long)in_stack_fffffffffffffd60,
               (allocator<unsigned_long> *)in_stack_fffffffffffffd58);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x2a9c00);
    for (local_b0 = 0; local_b0 < 100; local_b0 = local_b0 + 1) {
      std::bitset<100UL>::operator[]
                ((bitset<100UL> *)in_stack_fffffffffffffd58,
                 CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
      bVar2 = std::bitset::reference::operator_cast_to_bool
                        ((reference *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50))
      ;
      std::bitset<100UL>::reference::~reference(&local_c0);
      if ((bVar2) &&
         (bVar2 = std::bitset<100UL>::operator[]
                            ((bitset<100UL> *)
                             CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                             (size_t)in_stack_fffffffffffffd48), !bVar2)) {
        bVar2 = std::bitset<100UL>::operator[]
                          ((bitset<100UL> *)
                           CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                           (size_t)in_stack_fffffffffffffd48);
        if (bVar2) {
          std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                     )0x2a9ccc);
          QueryCompiler::numberOfViews((QueryCompiler *)0x2a9cd4);
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                    ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_fffffffffffffd60,(size_type)in_stack_fffffffffffffd58,
                     (bool)in_stack_fffffffffffffd57);
        }
        else {
          local_c8 = *(long *)(in_RDI + 0xa8) + *local_48 * 0x18;
          local_d0._M_current =
               (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         (&in_stack_fffffffffffffd48->m_bits);
          local_d8 = (unsigned_long *)
                     std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                               (&in_stack_fffffffffffffd48->m_bits);
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50)
                                    ,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                      *)in_stack_fffffffffffffd48), bVar2) {
            local_e0 = __gnu_cxx::
                       __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       ::operator*(&local_d0);
            std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2a9dcc);
            QueryCompiler::getView
                      ((QueryCompiler *)
                       CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                       (size_t)in_stack_fffffffffffffd48);
            std::bitset<100UL>::operator[]
                      ((bitset<100UL> *)in_stack_fffffffffffffd58,
                       CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
            bVar2 = std::bitset::reference::operator_cast_to_bool
                              ((reference *)
                               CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
            std::bitset<100UL>::reference::~reference(&local_f0);
            if (bVar2) {
              boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffd60,(size_type)in_stack_fffffffffffffd58,
                         (bool)in_stack_fffffffffffffd57);
            }
            __gnu_cxx::
            __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::operator++(&local_d0);
          }
        }
      }
    }
    std::
    vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator[]((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)(in_RDI + 0x5e0),*local_48);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
               in_stack_fffffffffffffd48);
    local_f8 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    while (in_stack_fffffffffffffd70 = local_f8,
          pdVar8 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                   std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::size
                             (&local_50->_aggregates), in_stack_fffffffffffffd70 < pdVar8) {
      std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                (&local_50->_aggregates,(size_type)local_f8);
      Aggregate::Aggregate(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      in_stack_fffffffffffffd68 =
           std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::size
                     ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                      (local_140 + 0x18));
      local_15d._5_8_ = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_20);
      local_15d._1_4_ = 0;
      std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_int,_true>
                ((pair<unsigned_long,_unsigned_long> *)(local_15d + 0xd),
                 (unsigned_long *)(local_15d + 5),(int *)(local_15d + 1));
      in_stack_fffffffffffffd60 = (Aggregate *)local_15d;
      std::allocator<std::pair<unsigned_long,_unsigned_long>_>::allocator
                ((allocator<std::pair<unsigned_long,_unsigned_long>_> *)0x2a9f7e);
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               (value_type *)in_stack_fffffffffffffd60,(allocator_type *)in_stack_fffffffffffffd58);
      std::allocator<std::pair<unsigned_long,_unsigned_long>_>::~allocator
                ((allocator<std::pair<unsigned_long,_unsigned_long>_> *)0x2a9fac);
      in_stack_fffffffffffffd58 = (Aggregate *)(in_RDI + 0x538);
      std::vector<DependentComputation,_std::allocator<DependentComputation>_>::clear
                ((vector<DependentComputation,_std::allocator<DependentComputation>_> *)0x2a9fc5);
      std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::size
                ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                 (local_140 + 0x18));
      std::vector<DependentComputation,_std::allocator<DependentComputation>_>::resize
                ((vector<DependentComputation,_std::allocator<DependentComputation>_> *)
                 in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      in_stack_fffffffffffffd48 =
           (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)local_140;
      registerAggregatesToVariables
                (in_stack_00000bf0,in_stack_00000be8,in_stack_00000be0,in_stack_00000bd8,
                 in_stack_00000bd0,in_stack_00000bc8,in_stack_00000c00);
      std::
      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 *)in_stack_fffffffffffffd60);
      Aggregate::~Aggregate
                ((Aggregate *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
      local_f8 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                 ((long)&(((_Vector_base<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>,_std::allocator<std::map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_std::less<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>_>_>
                            *)&local_f8->m_bits)->_M_impl).super__Vector_impl_data._M_start + 1);
    }
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset
              ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x2aa0cf);
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_38);
  }
  std::operator<<((ostream *)&std::cerr,"Why is this?! \n ");
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_50->_origin);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_50->_destination);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(ulong *)(local_18 + 0x30));
  poVar6 = std::operator<<(poVar6," ");
  ppAVar3 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                      (&local_50->_aggregates,0);
  sVar4 = std::
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ::size(&(*ppAVar3)->_incoming);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar4);
  poVar6 = std::operator<<(poVar6,"  ");
  ppAVar3 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                      (&local_50->_aggregates,0);
  sVar4 = std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::size
                    (&(*ppAVar3)->_agg);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar4);
  std::operator<<(poVar6,"\n");
  for (local_60 = 0; uVar1 = local_60,
      sVar4 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::size(&local_50->_aggregates),
      uVar1 < sVar4; local_60 = local_60 + 1) {
    local_68 = 0;
    local_70 = 0;
    while( true ) {
      uVar1 = local_70;
      ppAVar3 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          (&local_50->_aggregates,local_60);
      sVar4 = std::
              vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::size(&(*ppAVar3)->_incoming);
      if (sVar4 <= uVar1) break;
      ppAVar3 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          (&local_50->_aggregates,local_60);
      pvVar7 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[](&(*ppAVar3)->_incoming,local_68);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pvVar7->first);
      poVar6 = std::operator<<(poVar6," ");
      ppAVar3 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                          (&local_50->_aggregates,local_60);
      pvVar7 = std::
               vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ::operator[](&(*ppAVar3)->_incoming,local_68);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,pvVar7->second);
      std::operator<<(poVar6," - ");
      local_68 = local_68 + 1;
      local_70 = local_70 + 1;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  }
  exit(1);
}

Assistant:

void CppGenerator::aggregateGenerator(size_t group_id, const TDNode& node)
{
    const std::vector<size_t>& varOrder = groupVariableOrder[group_id];
    const var_bitset& varOrderBitset = groupVariableOrderBitset[group_id];
    
    aggregateHeader.clear();

    // Compute the level of the views in this group 
    computeViewLevel(group_id,node);
    
    // TODO: TODO: TODO: Make sure the below is necessary 
    localProductList.clear();
    localProductMap.clear();
    contributingViewList.clear();
    
    viewProductList.clear();
    viewProductMap.clear();

    newAggregateRegister.clear();
    aggregateRegisterMap.clear();
    
    productToVariableMap.clear();
    productToVariableRegister.clear();

    postRegisterList.clear();
    postRegisterMap.clear();

    totalLoopFactors.clear();
    totalLoopFactorList.clear();
    
    productLoopID.clear();
    incViewLoopID.clear();

    aggregateComputation.clear();
    
    localProductList.resize(varOrder.size() * 2);
    localProductMap.resize(varOrder.size()* 2);
    contributingViewList.resize(varOrder.size() * 2);
    
    viewProductList.resize(varOrder.size() * 2);
    viewProductMap.resize(varOrder.size() * 2);

    newAggregateRegister.resize(varOrder.size());
    aggregateRegisterMap.resize(varOrder.size());

    postRegisterList.resize(varOrder.size());
    postRegisterMap.resize(varOrder.size());

    totalLoopFactors.resize(varOrder.size() * 2);
    totalLoopFactorList.resize(varOrder.size());
    
    productLoopID.resize(varOrder.size() * 2);
    incViewLoopID.resize(varOrder.size() * 2);
    aggRegLoopID.resize(varOrder.size() * 2);

    aggregateRemapping.resize(newAggregateRegister.size());
    localProductRemapping.resize(localProductList.size());
    viewProductRemapping.resize(viewProductList.size());

    postRemapping.clear();
    postRemapping.resize(varOrder.size() + 1);

    productToVariableMap.resize(varOrder.size()*2);
    productToVariableRegister.resize(varOrder.size()*2);

    aggregateComputation.resize(_qc->numberOfViews());

    newAggregateRemapping.resize(varOrder.size());
    // localProductRemapping.resize(varOrder.size());
    // viewProductRemapping.resize(varOrder.size());
    // TODO: TODO: TODO: TODO: TODO: check if the above is correct 
    
    for (const size_t& viewID : viewGroups[group_id])
    {
        View* view = _qc->getView(viewID);


        size_t numberIncomingViews =
            (view->_origin == view->_destination ? node._numOfNeighbors :
             node._numOfNeighbors - 1);
        
        if (numberIncomingViews !=
            view->_aggregates[0]->_incoming.size() / view->_aggregates[0]->_agg.size())
        {
            ERROR("Why is this?! \n ");
            ERROR(view->_origin << " " << view->_destination << " " <<
                  node._numOfNeighbors << " " <<
                  view->_aggregates[0]->_incoming.size()  << "  " << 
                  view->_aggregates[0]->_agg.size()  << "\n");

            for (size_t aggNo = 0; aggNo < view->_aggregates.size(); ++aggNo)
            {
                size_t incCounter = 0;
                for (size_t inc = 0; inc <
                         view->_aggregates[aggNo]->_incoming.size(); ++inc)
                {
                    std::cout << view->_aggregates[aggNo]->_incoming[incCounter].first
                              << " " <<
                        view->_aggregates[aggNo]->_incoming[incCounter].second << " - ";
                    incCounter++;
                }
                std::cout << std::endl;
            }
            exit(1);
        }

        dyn_bitset loopFactors(_qc->numberOfViews()+1);

        // Compute the loops that are required by this view. 
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (view->_fVars[var])
            {
                if (!varOrderBitset[var])
                {
                    // if var is in relation - use relation 
                    if (node._bag[var])
                    {                                   
                        loopFactors.set(_qc->numberOfViews());
                    }
                    else // else find corresponding view 
                    {
                        for (const size_t& incViewID : incomingViews[viewID])
                        {
                            if (_qc->getView(incViewID)->_fVars[var])
                                loopFactors.set(incViewID);
                        }
                    }
                }
            }
        }

        outViewLoop[viewID] = loopFactors;
        
        // We add loop Factors for this view to the totalLoopFactors and keep
        // track of the id.
        // if (viewLevelRegister[viewID] != varOrder.size())
        // {            
        //     size_t depDepth = varOrder.size() + viewLevelRegister[viewID];
        //     auto loopit = totalLoopFactors[depDepth].find(loopFactors);
        //     if (loopit != totalLoopFactors[depDepth].end())
        //     {
        //         outViewLoopID[viewID] = loopit->second;
        //     }
        //     else
        //     {
        //         size_t loopID = totalLoopFactors[depDepth].size();
        //         outViewLoopID[viewID] = loopID;            
        //         totalLoopFactors[depDepth][loopFactors] = loopID;
        //     }
        // }
        
        for (size_t aggNo = 0; aggNo < view->_aggregates.size(); ++aggNo)
        {
            // We use a copy of the actual aggregate
            Aggregate aggregate = *(view->_aggregates[aggNo]);

            std::vector<std::pair<size_t, size_t>>
                localAggReg(aggregate._agg.size(),{varOrder.size(), 0});

            dependentComputation.clear();
            dependentComputation.resize(aggregate._agg.size());

            // computeAggregateRegister(&aggregate,group_id,viewID,aggNo,0,localAggReg);
            registerAggregatesToVariables
                (&aggregate,group_id,viewID,aggNo,0,localAggReg);
        }
    }

    // DINFO("Registered Aggregates to Variables \n"); 
}